

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_v4l2.h
# Opt level: O3

vector<v4l2_fmtdesc,_std::allocator<v4l2_fmtdesc>_> *
util_v4l2::query_formats
          (vector<v4l2_fmtdesc,_std::allocator<v4l2_fmtdesc>_> *__return_storage_ptr__,int fd,
          error_code *err)

{
  iterator __position;
  int iVar1;
  pointer pvVar2;
  pointer pvVar3;
  v4l2_fmtdesc fmt;
  v4l2_fmtdesc local_60;
  
  if (err != (error_code *)0x0) {
    *err = ERR_NO_ERROR;
  }
  (__return_storage_ptr__->super__Vector_base<v4l2_fmtdesc,_std::allocator<v4l2_fmtdesc>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<v4l2_fmtdesc,_std::allocator<v4l2_fmtdesc>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<v4l2_fmtdesc,_std::allocator<v4l2_fmtdesc>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60.index = 0;
  local_60.type = 1;
  iVar1 = xioctl(fd,-0x3fbfa9fe,&local_60);
  if (iVar1 == -1) {
    pvVar2 = (pointer)0x0;
    pvVar3 = (pointer)0x0;
  }
  else {
    do {
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<v4l2_fmtdesc,_std::allocator<v4l2_fmtdesc>_>)
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<v4l2_fmtdesc,_std::allocator<v4l2_fmtdesc>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<v4l2_fmtdesc,std::allocator<v4l2_fmtdesc>>::
        _M_realloc_insert<v4l2_fmtdesc_const&>
                  ((vector<v4l2_fmtdesc,std::allocator<v4l2_fmtdesc>> *)__return_storage_ptr__,
                   __position,&local_60);
      }
      else {
        (__position._M_current)->mbus_code = local_60.mbus_code;
        (__position._M_current)->reserved[0] = local_60.reserved[0];
        *(undefined8 *)((__position._M_current)->reserved + 1) = local_60.reserved._4_8_;
        *(undefined8 *)((__position._M_current)->description + 0x14) = local_60.description._20_8_;
        *(undefined8 *)((__position._M_current)->description + 0x1c) = local_60._40_8_;
        *(undefined8 *)((__position._M_current)->description + 4) = local_60.description._4_8_;
        *(undefined8 *)((__position._M_current)->description + 0xc) = local_60.description._12_8_;
        (__position._M_current)->index = local_60.index;
        (__position._M_current)->type = local_60.type;
        (__position._M_current)->flags = local_60.flags;
        (__position._M_current)->description[0] = local_60.description[0];
        (__position._M_current)->description[1] = local_60.description[1];
        (__position._M_current)->description[2] = local_60.description[2];
        (__position._M_current)->description[3] = local_60.description[3];
        (__return_storage_ptr__->super__Vector_base<v4l2_fmtdesc,_std::allocator<v4l2_fmtdesc>_>).
        _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      local_60.index = local_60.index + 1;
      iVar1 = xioctl(fd,-0x3fbfa9fe,&local_60);
    } while (iVar1 != -1);
    pvVar2 = (__return_storage_ptr__->
             super__Vector_base<v4l2_fmtdesc,_std::allocator<v4l2_fmtdesc>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pvVar3 = (__return_storage_ptr__->
             super__Vector_base<v4l2_fmtdesc,_std::allocator<v4l2_fmtdesc>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  }
  if ((err != (error_code *)0x0) && (pvVar3 == pvVar2)) {
    *err = ERR_QUERYING_FORMAT;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<v4l2_fmtdesc> query_formats(int fd, error_code *err) {
        SET_ERR_CODE(err, error_code::ERR_NO_ERROR);

        std::vector<v4l2_fmtdesc> formats;
        struct v4l2_fmtdesc fmt;
        fmt.index = 0;
        fmt.type = V4L2_BUF_TYPE_VIDEO_CAPTURE;

        while (-1 != util_v4l2::xioctl(fd, VIDIOC_ENUM_FMT, &fmt)) {
            formats.push_back(fmt);
            fmt.index++;
        }
        if (formats.size() == 0) {
            SET_ERR_CODE(err, error_code::ERR_QUERYING_FORMAT);
        }
        return formats;
    }